

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::call_a16<(SM83::Conditions)2>(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>,_const_unsigned_short_&>
  fmt;
  undefined6 uStack_28;
  u16 address;
  unsigned_short local_20 [4];
  char *local_18;
  
  address = GetWordFromPC(this);
  local_20 = (unsigned_short  [4])0x2;
  local_18 = "NC";
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4f;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>,unsigned_short_const&>
            ((v11 *)
             "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  CALL {}, 0x{:04X}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,local_20,
             (basic_string_view<char,_std::char_traits<char>_> *)&address,
             (unsigned_short *)CONCAT26(address,uStack_28));
  if (((this->field_0).field_1.f & 0x10) == 0) {
    StackPush(this,this->pc);
    this->pc = address;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::call_a16() {
    const u16 address = GetWordFromPC();

    if constexpr (cond == Conditions::None) {
        LTRACE("CALL 0x{:04X}", address);
    } else {
        LTRACE("CALL {}, 0x{:04X}", GetConditionString<cond>(), address);
    }

    if (MeetsCondition<cond>()) {
        StackPush(pc);
        pc = address;
        timer.AdvanceCycles(4);
    }
}